

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall
TokenSequenceParser::addEntry
          (TokenSequenceParser *this,int result,TokenSequence tokens,TokenValueSequence values)

{
  Entry entry;
  allocator_type local_5a;
  allocator_type local_59;
  value_type local_58;
  
  std::vector<TokenType,_std::allocator<TokenType>_>::vector(&local_58.tokens,tokens,&local_59);
  std::vector<TokenSequenceValue,_std::allocator<TokenSequenceValue>_>::vector
            (&local_58.values,values,&local_5a);
  local_58.result = result;
  std::vector<TokenSequenceParser::Entry,_std::allocator<TokenSequenceParser::Entry>_>::push_back
            (&this->entries,&local_58);
  Entry::~Entry(&local_58);
  return;
}

Assistant:

void TokenSequenceParser::addEntry(int result, TokenSequence tokens, TokenValueSequence values)
{
	Entry entry = { tokens, values, result };
	entries.push_back(entry);
}